

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Query
          (ClientContext *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,bool allow_stream_result)

{
  pointer pPVar1;
  undefined7 in_register_00000011;
  pointer *__ptr;
  undefined1 local_c8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_a0;
  ErrorData local_90;
  
  local_b8._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        CONCAT71(in_register_00000011,allow_stream_result);
  *(long *)CONCAT71(in_register_00000011,allow_stream_result) = 0;
  PendingQuery((ClientContext *)local_c8,statement,SUB81(&local_b8,0));
  if ((element_type *)local_b8._M_pi != (element_type *)0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((((enable_shared_from_this<duckdb::DatabaseInstance> *)
                         &(local_b8._M_pi)->_vptr__Sp_counted_base)->__weak_this_).internal.
                        super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                      __weak_this_ + 8))->_M_pi)();
  }
  pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_c8);
  if ((pPVar1->super_BaseQueryResult).success == false) {
    pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_c8);
    ErrorData::ErrorData(&local_90,&(pPVar1->super_BaseQueryResult).error);
    local_b0._M_pi = &local_a0;
    local_a8._0_1_ = (__atomic_base<bool>)0x0;
    local_a8._1_7_ = 0;
    local_a0._vptr__Sp_counted_base._0_1_ = 0;
    ErrorResult<duckdb::MaterializedQueryResult>
              ((ClientContext *)(local_c8 + 8),(ErrorData *)statement,(string *)&local_90);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c8._8_8_;
    local_c8._8_8_ = (element_type *)0x0;
    ::std::__cxx11::string::~string((string *)&local_b0);
    ErrorData::~ErrorData(&local_90);
  }
  else {
    unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
    operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                *)local_c8);
    PendingQueryResult::Execute((PendingQueryResult *)this);
  }
  if ((element_type *)local_c8._0_8_ != (element_type *)0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((((weak_ptr<duckdb::ClientContext,_true> *)
                         &((BaseQueryResult *)local_c8._0_8_)->_vptr_BaseQueryResult)->internal).
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->
              _M_pi)();
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Query(unique_ptr<SQLStatement> statement, bool allow_stream_result) {
	auto pending_query = PendingQuery(std::move(statement), allow_stream_result);
	if (pending_query->HasError()) {
		return ErrorResult<MaterializedQueryResult>(pending_query->GetErrorObject());
	}
	return pending_query->Execute();
}